

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O1

Fraig_HashTable_t * Fraig_HashTableCreate(int nSize)

{
  uint uVar1;
  Fraig_HashTable_t *pFVar2;
  Fraig_Node_t **__s;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  pFVar2 = (Fraig_HashTable_t *)malloc(0x10);
  pFVar2->pBins = (Fraig_Node_t **)0x0;
  pFVar2->nBins = 0;
  pFVar2->nEntries = 0;
  uVar4 = nSize - 1;
  while( true ) {
    do {
      uVar5 = uVar4 + 1;
      uVar1 = uVar4 & 1;
      uVar4 = uVar5;
    } while (uVar1 != 0);
    if (uVar5 < 9) break;
    iVar3 = 5;
    while( true ) {
      if (uVar5 % (iVar3 - 2U) == 0) break;
      uVar1 = iVar3 * iVar3;
      iVar3 = iVar3 + 2;
      if (uVar5 < uVar1) goto LAB_0068b43f;
    }
  }
LAB_0068b43f:
  pFVar2->nBins = uVar5;
  __s = (Fraig_Node_t **)malloc((long)(int)uVar5 << 3);
  pFVar2->pBins = __s;
  memset(__s,0,(long)(int)uVar5 << 3);
  return pFVar2;
}

Assistant:

Fraig_HashTable_t * Fraig_HashTableCreate( int nSize )
{
    Fraig_HashTable_t * p;
    // allocate the table
    p = ABC_ALLOC( Fraig_HashTable_t, 1 );
    memset( p, 0, sizeof(Fraig_HashTable_t) );
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(nSize);
    p->pBins = ABC_ALLOC( Fraig_Node_t *, p->nBins );
    memset( p->pBins, 0, sizeof(Fraig_Node_t *) * p->nBins );
    return p;
}